

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBuffer
          (RenderDeviceGLImpl *this,BufferDesc *BuffDesc,BufferData *pBuffData,IBuffer **ppBuffer,
          bool bIsDeviceInternal)

{
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  bool local_51;
  undefined1 local_50 [16];
  string local_40;
  
  local_51 = bIsDeviceInternal;
  local_50._8_8_ = pBuffData;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)local_50,(size_t)this);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    FormatString<char[44]>
              ((string *)(local_50 + 0x10),
               (char (*) [44])"Immediate device context has been destroyed");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x16a);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  local_40._M_dataplus._M_p = (pointer)(local_50._0_8_ + 0x750);
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,Diligent::BufferData_const*,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppBuffer,BuffDesc,
             (reference_wrapper<Diligent::GLContextState> *)(local_50 + 0x10),
             (BufferData **)(local_50 + 8),&local_51);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_50);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBuffer(const BufferDesc& BuffDesc, const BufferData* pBuffData, IBuffer** ppBuffer, bool bIsDeviceInternal)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), pBuffData, bIsDeviceInternal);
}